

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O3

void pulse_prog_alstea_ehrlouge(CHAR_DATA *mob)

{
  uint uVar1;
  char *format;
  
  get_room_index(0);
  if (((mob->fighting == (CHAR_DATA *)0x0) && (mob->position < 6)) && (mob->in_room->vnum == 0x69))
  {
    uVar1 = number_percent();
    if ((int)uVar1 < 4) {
      format = "Ehrlouge scribbles something down violently, his teeth gritting and chattering.";
    }
    else {
      if (uVar1 < 0x62) {
        return;
      }
      format = 
      "The skeletal figure of Ehrlouge begins to shudder and tremble as he dryly and raspily whimpers."
      ;
    }
    act(format,mob,(void *)0x0,(void *)0x0,0);
    return;
  }
  return;
}

Assistant:

void pulse_prog_alstea_ehrlouge(CHAR_DATA *mob)
{
	ROOM_INDEX_DATA *study = get_room_index(105);

	if (mob->fighting || mob->position > POS_RESTING)
		return;

	if (mob->in_room->vnum != 105)
		return;

	int rnd = number_percent();

	if (rnd < 4)
	{
		act("Ehrlouge scribbles something down violently, his teeth gritting and chattering.", mob, 0, 0, TO_ROOM);
		return;
	}

	if (rnd > 97)
	{
		act("The skeletal figure of Ehrlouge begins to shudder and tremble as he dryly and raspily whimpers.", mob, 0, 0, TO_ROOM);
		return;
	}
}